

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<5,_4,_2>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  bool bVar2;
  int i;
  bool bVar3;
  float *pfVar4;
  long lVar5;
  float *pfVar6;
  int col;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  Vector<float,_3> res;
  undefined8 local_58;
  int aiStack_50 [6];
  undefined8 local_38;
  undefined4 local_30;
  float local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    fVar8 = (evalCtx->coords).m_data[0];
    fVar9 = (evalCtx->coords).m_data[1];
    fVar10 = (evalCtx->coords).m_data[2];
    fVar11 = (evalCtx->coords).m_data[3];
    fVar13 = fVar8;
    fVar12 = fVar9;
  }
  else {
    fVar8 = 1.4;
    fVar9 = 0.2;
    fVar10 = -0.5;
    fVar11 = 0.7;
    fVar13 = (evalCtx->coords).m_data[0];
    fVar12 = (evalCtx->coords).m_data[1];
  }
  if (in1Type != INPUTTYPE_DYNAMIC) {
    fVar13 = 0.5;
  }
  pfVar1 = (float *)((long)&local_58 + 4);
  aiStack_50[2] = 0;
  aiStack_50[3] = 0;
  aiStack_50[4] = 0;
  aiStack_50[5] = 0;
  local_58 = 0;
  aiStack_50[0] = 0;
  aiStack_50[1] = 0;
  lVar5 = 0;
  pfVar4 = (float *)&local_58;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    lVar7 = 0;
    do {
      fVar14 = 1.0;
      if (lVar5 != lVar7) {
        fVar14 = 0.0;
      }
      pfVar4[lVar7 * 2] = fVar14;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    lVar5 = 1;
    pfVar4 = pfVar1;
    bVar2 = false;
  } while (bVar3);
  if (in1Type != INPUTTYPE_DYNAMIC) {
    fVar12 = 1.0;
  }
  pfVar4 = (float *)&local_58;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    *pfVar4 = fVar13 * fVar8;
    pfVar4[2] = fVar13 * fVar9;
    pfVar4[4] = fVar13 * fVar10;
    pfVar4[6] = fVar13 * fVar11;
    pfVar4 = pfVar1;
    fVar13 = fVar12;
    bVar2 = false;
  } while (bVar3);
  local_18 = 0x3f800000;
  uStack_10 = 0;
  uStack_24 = 0x3f800000;
  uStack_20 = 0;
  uStack_1c = 0;
  pfVar4 = (float *)&local_18;
  pfVar6 = (float *)&local_58;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    fVar8 = pfVar6[2];
    fVar9 = pfVar6[4];
    fVar10 = pfVar6[6];
    *pfVar4 = *pfVar6;
    pfVar4[1] = fVar8;
    pfVar4[2] = fVar9;
    pfVar4[3] = fVar10;
    pfVar4 = &local_28;
    pfVar6 = pfVar1;
    bVar2 = false;
  } while (bVar3);
  local_58 = local_18;
  aiStack_50[0] = (undefined4)uStack_10;
  local_38 = CONCAT44(uStack_20,uStack_24);
  local_30 = uStack_1c;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  lVar5 = 0;
  do {
    res.m_data[lVar5] =
         *(float *)((long)&local_58 + lVar5 * 4) + *(float *)((long)&local_38 + lVar5 * 4);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  aiStack_50[0] = 0;
  aiStack_50[1] = 1;
  aiStack_50[2] = 2;
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_58 + lVar5 * 4)] = res.m_data[lVar5 + -2];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}